

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void Fossilize::filter_feature_enablement
               (VkPhysicalDeviceFeatures2 *pdf,VulkanFeatures *features,
               VkPhysicalDeviceFeatures2 *target_features)

{
  VkPhysicalDeviceRobustness2FeaturesEXT *pVVar1;
  VkPhysicalDeviceImageRobustnessFeatures *pVVar2;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *pVVar3;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *pVVar4;
  VkPhysicalDeviceMeshShaderFeaturesEXT *pVVar5;
  VkPhysicalDeviceMeshShaderFeaturesNV *pVVar6;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT *pVVar7;
  VkPhysicalDeviceShaderObjectFeaturesEXT *pVVar8;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *pVVar9;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *pVVar10;
  bool local_8c;
  bool local_8b;
  bool local_8a;
  bool local_89;
  bool local_88;
  bool local_87;
  bool local_86;
  bool local_85;
  bool local_84;
  bool local_83;
  bool local_82;
  bool local_81;
  bool local_80;
  bool local_7f;
  bool local_7e;
  bool local_7d;
  bool local_7c;
  bool local_7b;
  bool local_7a;
  bool local_79;
  bool local_78;
  bool local_77;
  bool local_76;
  bool local_75;
  bool local_74;
  bool local_73;
  bool local_72;
  bool local_71;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *image_2d_view_of_3d;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *prim_generated;
  VkPhysicalDeviceShaderObjectFeaturesEXT *shader_object;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT *descriptor_buffer;
  VkPhysicalDeviceMeshShaderFeaturesNV *mesh_shader_nv;
  VkPhysicalDeviceMeshShaderFeaturesEXT *mesh_shader;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *fragment_shading_rate;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums;
  VkPhysicalDeviceImageRobustnessFeatures *image_robustness;
  VkPhysicalDeviceRobustness2FeaturesEXT *robustness2;
  VkPhysicalDeviceFeatures2 *target_features_local;
  VulkanFeatures *features_local;
  VkPhysicalDeviceFeatures2 *pdf_local;
  
  if ((((features->fragment_shading_rate).pipelineFragmentShadingRate == 1) ||
      ((features->fragment_shading_rate).attachmentFragmentShadingRate == 1)) ||
     ((features->fragment_shading_rate).primitiveFragmentShadingRate == 1)) {
    (features->shading_rate_nv).shadingRateImage = 0;
    (features->shading_rate_nv).shadingRateCoarseSampleOrder = 0;
    (features->fragment_density).fragmentDensityMap = 0;
  }
  if (target_features == (VkPhysicalDeviceFeatures2 *)0x0) {
    (pdf->features).robustBufferAccess = 0;
    reset_features(&features->robustness2,0);
    reset_features(&features->image_robustness,0);
    reset_features(&features->fragment_shading_rate_enums,0);
    reset_features(&features->fragment_shading_rate,0);
    reset_features(&features->mesh_shader,0);
    reset_features(&features->mesh_shader_nv,0);
    reset_features(&features->descriptor_buffer,0);
    reset_features(&features->shader_object,0);
    reset_features(&features->primitives_generated_query,0);
    reset_features(&features->image_2d_view_of_3d,0);
  }
  else {
    local_71 = false;
    if ((pdf->features).robustBufferAccess != 0) {
      local_71 = (target_features->features).robustBufferAccess != 0;
    }
    (pdf->features).robustBufferAccess = (uint)local_71;
    pVVar1 = find_pnext<VkPhysicalDeviceRobustness2FeaturesEXT>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT,
                        target_features->pNext);
    if (pVVar1 == (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0) {
      reset_features(&features->robustness2,0);
    }
    else {
      local_72 = false;
      if ((features->robustness2).robustBufferAccess2 != 0) {
        local_72 = pVVar1->robustBufferAccess2 != 0;
      }
      (features->robustness2).robustBufferAccess2 = (uint)local_72;
      local_73 = false;
      if ((features->robustness2).robustImageAccess2 != 0) {
        local_73 = pVVar1->robustImageAccess2 != 0;
      }
      (features->robustness2).robustImageAccess2 = (uint)local_73;
      local_74 = false;
      if ((features->robustness2).nullDescriptor != 0) {
        local_74 = pVVar1->nullDescriptor != 0;
      }
      (features->robustness2).nullDescriptor = (uint)local_74;
    }
    pVVar2 = find_pnext<VkPhysicalDeviceImageRobustnessFeatures>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES,
                        target_features->pNext);
    if (pVVar2 == (VkPhysicalDeviceImageRobustnessFeatures *)0x0) {
      reset_features(&features->image_robustness,0);
    }
    else {
      local_75 = false;
      if ((features->image_robustness).robustImageAccess != 0) {
        local_75 = pVVar2->robustImageAccess != 0;
      }
      (features->image_robustness).robustImageAccess = (uint)local_75;
    }
    pVVar3 = find_pnext<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV,
                        target_features->pNext);
    if (pVVar3 == (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *)0x0) {
      reset_features(&features->fragment_shading_rate_enums,0);
    }
    else {
      local_76 = false;
      if ((features->fragment_shading_rate_enums).fragmentShadingRateEnums != 0) {
        local_76 = pVVar3->fragmentShadingRateEnums != 0;
      }
      (features->fragment_shading_rate_enums).fragmentShadingRateEnums = (uint)local_76;
      local_77 = false;
      if ((features->fragment_shading_rate_enums).noInvocationFragmentShadingRates != 0) {
        local_77 = pVVar3->noInvocationFragmentShadingRates != 0;
      }
      (features->fragment_shading_rate_enums).noInvocationFragmentShadingRates = (uint)local_77;
      local_78 = false;
      if ((features->fragment_shading_rate_enums).supersampleFragmentShadingRates != 0) {
        local_78 = pVVar3->supersampleFragmentShadingRates != 0;
      }
      (features->fragment_shading_rate_enums).supersampleFragmentShadingRates = (uint)local_78;
    }
    pVVar4 = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR,
                        target_features->pNext);
    if (pVVar4 == (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)0x0) {
      reset_features(&features->fragment_shading_rate,0);
    }
    else {
      local_79 = false;
      if ((features->fragment_shading_rate).pipelineFragmentShadingRate != 0) {
        local_79 = pVVar4->pipelineFragmentShadingRate != 0;
      }
      (features->fragment_shading_rate).pipelineFragmentShadingRate = (uint)local_79;
      local_7a = false;
      if ((features->fragment_shading_rate).primitiveFragmentShadingRate != 0) {
        local_7a = pVVar4->primitiveFragmentShadingRate != 0;
      }
      (features->fragment_shading_rate).primitiveFragmentShadingRate = (uint)local_7a;
      local_7b = false;
      if ((features->fragment_shading_rate).attachmentFragmentShadingRate != 0) {
        local_7b = pVVar4->attachmentFragmentShadingRate != 0;
      }
      (features->fragment_shading_rate).attachmentFragmentShadingRate = (uint)local_7b;
    }
    pVVar5 = find_pnext<VkPhysicalDeviceMeshShaderFeaturesEXT>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT,
                        target_features->pNext);
    if (pVVar5 == (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0) {
      reset_features(&features->mesh_shader,0);
    }
    else {
      local_7c = false;
      if ((features->mesh_shader).taskShader != 0) {
        local_7c = pVVar5->taskShader != 0;
      }
      (features->mesh_shader).taskShader = (uint)local_7c;
      local_7d = false;
      if ((features->mesh_shader).meshShader != 0) {
        local_7d = pVVar5->meshShader != 0;
      }
      (features->mesh_shader).meshShader = (uint)local_7d;
      local_7e = false;
      if ((features->mesh_shader).multiviewMeshShader != 0) {
        local_7e = pVVar5->multiviewMeshShader != 0;
      }
      (features->mesh_shader).multiviewMeshShader = (uint)local_7e;
      local_7f = false;
      if ((features->mesh_shader).meshShaderQueries != 0) {
        local_7f = pVVar5->meshShaderQueries != 0;
      }
      (features->mesh_shader).meshShaderQueries = (uint)local_7f;
      local_80 = false;
      if (((features->mesh_shader).primitiveFragmentShadingRateMeshShader != 0) &&
         (local_80 = false, (features->fragment_shading_rate).primitiveFragmentShadingRate != 0)) {
        local_80 = pVVar5->primitiveFragmentShadingRateMeshShader != 0;
      }
      (features->mesh_shader).primitiveFragmentShadingRateMeshShader = (uint)local_80;
    }
    pVVar6 = find_pnext<VkPhysicalDeviceMeshShaderFeaturesNV>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV,
                        target_features->pNext);
    if (pVVar6 == (VkPhysicalDeviceMeshShaderFeaturesNV *)0x0) {
      reset_features(&features->mesh_shader_nv,0);
    }
    else {
      local_81 = false;
      if ((features->mesh_shader_nv).taskShader != 0) {
        local_81 = pVVar5->taskShader != 0;
      }
      (features->mesh_shader_nv).taskShader = (uint)local_81;
      local_82 = false;
      if ((features->mesh_shader_nv).meshShader != 0) {
        local_82 = pVVar5->meshShader != 0;
      }
      (features->mesh_shader_nv).meshShader = (uint)local_82;
    }
    pVVar7 = find_pnext<VkPhysicalDeviceDescriptorBufferFeaturesEXT>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT,
                        target_features->pNext);
    if (pVVar7 == (VkPhysicalDeviceDescriptorBufferFeaturesEXT *)0x0) {
      reset_features(&features->descriptor_buffer,0);
    }
    else {
      local_83 = false;
      if ((features->descriptor_buffer).descriptorBuffer != 0) {
        local_83 = pVVar7->descriptorBuffer != 0;
      }
      (features->descriptor_buffer).descriptorBuffer = (uint)local_83;
      local_84 = false;
      if ((features->descriptor_buffer).descriptorBufferCaptureReplay != 0) {
        local_84 = pVVar7->descriptorBufferCaptureReplay != 0;
      }
      (features->descriptor_buffer).descriptorBufferCaptureReplay = (uint)local_84;
      local_85 = false;
      if ((features->descriptor_buffer).descriptorBufferImageLayoutIgnored != 0) {
        local_85 = pVVar7->descriptorBufferImageLayoutIgnored != 0;
      }
      (features->descriptor_buffer).descriptorBufferImageLayoutIgnored = (uint)local_85;
      local_86 = false;
      if ((features->descriptor_buffer).descriptorBufferPushDescriptors != 0) {
        local_86 = pVVar7->descriptorBufferPushDescriptors != 0;
      }
      (features->descriptor_buffer).descriptorBufferPushDescriptors = (uint)local_86;
    }
    pVVar8 = find_pnext<VkPhysicalDeviceShaderObjectFeaturesEXT>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT,
                        target_features->pNext);
    if (pVVar8 == (VkPhysicalDeviceShaderObjectFeaturesEXT *)0x0) {
      reset_features(&features->shader_object,0);
    }
    else {
      local_87 = false;
      if ((features->shader_object).shaderObject != 0) {
        local_87 = pVVar8->shaderObject != 0;
      }
      (features->shader_object).shaderObject = (uint)local_87;
    }
    pVVar9 = find_pnext<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT,
                        target_features->pNext);
    if (pVVar9 == (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *)0x0) {
      reset_features(&features->primitives_generated_query,0);
    }
    else {
      local_88 = false;
      if ((features->primitives_generated_query).primitivesGeneratedQuery != 0) {
        local_88 = pVVar9->primitivesGeneratedQuery != 0;
      }
      (features->primitives_generated_query).primitivesGeneratedQuery = (uint)local_88;
      local_89 = false;
      if ((features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams != 0) {
        local_89 = pVVar9->primitivesGeneratedQueryWithNonZeroStreams != 0;
      }
      (features->primitives_generated_query).primitivesGeneratedQueryWithNonZeroStreams =
           (uint)local_89;
      local_8a = false;
      if ((features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard != 0)
      {
        local_8a = pVVar9->primitivesGeneratedQueryWithRasterizerDiscard != 0;
      }
      (features->primitives_generated_query).primitivesGeneratedQueryWithRasterizerDiscard =
           (uint)local_8a;
    }
    pVVar10 = find_pnext<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>
                        (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT,
                         target_features->pNext);
    if (pVVar10 == (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)0x0) {
      reset_features(&features->image_2d_view_of_3d,0);
    }
    else {
      local_8b = false;
      if ((features->image_2d_view_of_3d).image2DViewOf3D != 0) {
        local_8b = pVVar10->image2DViewOf3D != 0;
      }
      (features->image_2d_view_of_3d).image2DViewOf3D = (uint)local_8b;
      local_8c = false;
      if ((features->image_2d_view_of_3d).sampler2DViewOf3D != 0) {
        local_8c = pVVar10->sampler2DViewOf3D != 0;
      }
      (features->image_2d_view_of_3d).sampler2DViewOf3D = (uint)local_8c;
    }
  }
  return;
}

Assistant:

static void filter_feature_enablement(
		VkPhysicalDeviceFeatures2 &pdf, VulkanFeatures &features,
		const VkPhysicalDeviceFeatures2 *target_features)
{
	// These feature bits conflict according to validation layers.
	if (features.fragment_shading_rate.pipelineFragmentShadingRate == VK_TRUE ||
	    features.fragment_shading_rate.attachmentFragmentShadingRate == VK_TRUE ||
	    features.fragment_shading_rate.primitiveFragmentShadingRate == VK_TRUE)
	{
		features.shading_rate_nv.shadingRateImage = VK_FALSE;
		features.shading_rate_nv.shadingRateCoarseSampleOrder = VK_FALSE;
		features.fragment_density.fragmentDensityMap = VK_FALSE;
	}

	// Only enable robustness if requested since it affects compilation on most implementations.
	if (target_features)
	{
		pdf.features.robustBufferAccess =
				pdf.features.robustBufferAccess && target_features->features.robustBufferAccess;

		const auto *robustness2 = find_pnext<VkPhysicalDeviceRobustness2FeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT,
				target_features->pNext);

		if (robustness2)
		{
			features.robustness2.robustBufferAccess2 =
					features.robustness2.robustBufferAccess2 && robustness2->robustBufferAccess2;
			features.robustness2.robustImageAccess2 =
					features.robustness2.robustImageAccess2 && robustness2->robustImageAccess2;
			features.robustness2.nullDescriptor =
					features.robustness2.nullDescriptor && robustness2->nullDescriptor;
		}
		else
		{
			reset_features(features.robustness2, VK_FALSE);
		}

		const auto *image_robustness = find_pnext<VkPhysicalDeviceImageRobustnessFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT,
				target_features->pNext);

		if (image_robustness)
		{
			features.image_robustness.robustImageAccess =
					features.image_robustness.robustImageAccess && image_robustness->robustImageAccess;
		}
		else
		{
			reset_features(features.image_robustness, VK_FALSE);
		}

		const auto *fragment_shading_rate_enums = find_pnext<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV,
				target_features->pNext);

		if (fragment_shading_rate_enums)
		{
			features.fragment_shading_rate_enums.fragmentShadingRateEnums =
					features.fragment_shading_rate_enums.fragmentShadingRateEnums &&
					fragment_shading_rate_enums->fragmentShadingRateEnums;

			features.fragment_shading_rate_enums.noInvocationFragmentShadingRates =
					features.fragment_shading_rate_enums.noInvocationFragmentShadingRates &&
					fragment_shading_rate_enums->noInvocationFragmentShadingRates;

			features.fragment_shading_rate_enums.supersampleFragmentShadingRates =
					features.fragment_shading_rate_enums.supersampleFragmentShadingRates &&
					fragment_shading_rate_enums->supersampleFragmentShadingRates;
		}
		else
		{
			reset_features(features.fragment_shading_rate_enums, VK_FALSE);
		}

		const auto *fragment_shading_rate = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR,
				target_features->pNext);

		if (fragment_shading_rate)
		{
			features.fragment_shading_rate.pipelineFragmentShadingRate =
					features.fragment_shading_rate.pipelineFragmentShadingRate &&
					fragment_shading_rate->pipelineFragmentShadingRate;
			features.fragment_shading_rate.primitiveFragmentShadingRate =
					features.fragment_shading_rate.primitiveFragmentShadingRate &&
					fragment_shading_rate->primitiveFragmentShadingRate;
			features.fragment_shading_rate.attachmentFragmentShadingRate =
					features.fragment_shading_rate.attachmentFragmentShadingRate &&
					fragment_shading_rate->attachmentFragmentShadingRate;
		}
		else
		{
			reset_features(features.fragment_shading_rate, VK_FALSE);
		}

		const auto *mesh_shader = find_pnext<VkPhysicalDeviceMeshShaderFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT,
				target_features->pNext);

		if (mesh_shader)
		{
			features.mesh_shader.taskShader =
					features.mesh_shader.taskShader && mesh_shader->taskShader;
			features.mesh_shader.meshShader =
					features.mesh_shader.meshShader && mesh_shader->meshShader;
			features.mesh_shader.multiviewMeshShader =
					features.mesh_shader.multiviewMeshShader && mesh_shader->multiviewMeshShader;
			features.mesh_shader.meshShaderQueries =
					features.mesh_shader.meshShaderQueries && mesh_shader->meshShaderQueries;
			features.mesh_shader.primitiveFragmentShadingRateMeshShader =
					features.mesh_shader.primitiveFragmentShadingRateMeshShader &&
					features.fragment_shading_rate.primitiveFragmentShadingRate &&
					mesh_shader->primitiveFragmentShadingRateMeshShader;
		}
		else
		{
			reset_features(features.mesh_shader, VK_FALSE);
		}

		const auto *mesh_shader_nv = find_pnext<VkPhysicalDeviceMeshShaderFeaturesNV>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV,
				target_features->pNext);

		if (mesh_shader_nv)
		{
			features.mesh_shader_nv.taskShader =
					features.mesh_shader_nv.taskShader && mesh_shader->taskShader;
			features.mesh_shader_nv.meshShader =
					features.mesh_shader_nv.meshShader && mesh_shader->meshShader;
		}
		else
		{
			reset_features(features.mesh_shader_nv, VK_FALSE);
		}

		const auto *descriptor_buffer = find_pnext<VkPhysicalDeviceDescriptorBufferFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT,
				target_features->pNext);

		if (descriptor_buffer)
		{
			features.descriptor_buffer.descriptorBuffer =
					features.descriptor_buffer.descriptorBuffer &&
					descriptor_buffer->descriptorBuffer;
			features.descriptor_buffer.descriptorBufferCaptureReplay =
					features.descriptor_buffer.descriptorBufferCaptureReplay &&
					descriptor_buffer->descriptorBufferCaptureReplay;
			features.descriptor_buffer.descriptorBufferImageLayoutIgnored =
					features.descriptor_buffer.descriptorBufferImageLayoutIgnored &&
					descriptor_buffer->descriptorBufferImageLayoutIgnored;
			features.descriptor_buffer.descriptorBufferPushDescriptors =
					features.descriptor_buffer.descriptorBufferPushDescriptors &&
					descriptor_buffer->descriptorBufferPushDescriptors;
		}
		else
		{
			reset_features(features.descriptor_buffer, VK_FALSE);
		}

		const auto *shader_object = find_pnext<VkPhysicalDeviceShaderObjectFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT,
				target_features->pNext);

		if (shader_object)
		{
			features.shader_object.shaderObject =
					features.shader_object.shaderObject &&
					shader_object->shaderObject;
		}
		else
		{
			reset_features(features.shader_object, VK_FALSE);
		}

		const auto *prim_generated = find_pnext<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT,
				target_features->pNext);

		if (prim_generated)
		{
			features.primitives_generated_query.primitivesGeneratedQuery =
					features.primitives_generated_query.primitivesGeneratedQuery &&
					prim_generated->primitivesGeneratedQuery;

			features.primitives_generated_query.primitivesGeneratedQueryWithNonZeroStreams =
					features.primitives_generated_query.primitivesGeneratedQueryWithNonZeroStreams &&
					prim_generated->primitivesGeneratedQueryWithNonZeroStreams;

			features.primitives_generated_query.primitivesGeneratedQueryWithRasterizerDiscard =
					features.primitives_generated_query.primitivesGeneratedQueryWithRasterizerDiscard &&
					prim_generated->primitivesGeneratedQueryWithRasterizerDiscard;
		}
		else
		{
			reset_features(features.primitives_generated_query, VK_FALSE);
		}

		const auto *image_2d_view_of_3d = find_pnext<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT,
				target_features->pNext);

		if (image_2d_view_of_3d)
		{
			features.image_2d_view_of_3d.image2DViewOf3D =
					features.image_2d_view_of_3d.image2DViewOf3D &&
					image_2d_view_of_3d->image2DViewOf3D;

			features.image_2d_view_of_3d.sampler2DViewOf3D =
					features.image_2d_view_of_3d.sampler2DViewOf3D &&
					image_2d_view_of_3d->sampler2DViewOf3D;
		}
		else
		{
			reset_features(features.image_2d_view_of_3d, VK_FALSE);
		}
	}
	else
	{
		pdf.features.robustBufferAccess = VK_FALSE;
		reset_features(features.robustness2, VK_FALSE);
		reset_features(features.image_robustness, VK_FALSE);
		reset_features(features.fragment_shading_rate_enums, VK_FALSE);
		reset_features(features.fragment_shading_rate, VK_FALSE);
		reset_features(features.mesh_shader, VK_FALSE);
		reset_features(features.mesh_shader_nv, VK_FALSE);
		reset_features(features.descriptor_buffer, VK_FALSE);
		reset_features(features.shader_object, VK_FALSE);
		reset_features(features.primitives_generated_query, VK_FALSE);
		reset_features(features.image_2d_view_of_3d, VK_FALSE);
	}
}